

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCPackIFWPackage.cxx
# Opt level: O3

void __thiscall cmCPackIFWPackage::GeneratePackageFile(cmCPackIFWPackage *this)

{
  char *pcVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  cmCPackIFWInstaller *pcVar3;
  pointer pcVar4;
  cmCPackIFWGenerator *pcVar5;
  undefined8 uVar6;
  pointer pbVar7;
  long *plVar8;
  _Rb_tree_node_base *p_Var9;
  _Rb_tree_node_base *p_Var10;
  _func_int **pp_Var11;
  size_type *psVar12;
  long lVar13;
  _Rb_tree_header *p_Var14;
  ulong uVar15;
  char *__end_2;
  char *__end;
  set<cmCPackIFWPackage::DependenceStruct,_std::less<cmCPackIFWPackage::DependenceStruct>,_std::allocator<cmCPackIFWPackage::DependenceStruct>_>
  compAutoDepSet;
  string path_3;
  set<cmCPackIFWPackage::DependenceStruct,_std::less<cmCPackIFWPackage::DependenceStruct>,_std::allocator<cmCPackIFWPackage::DependenceStruct>_>
  compDepSet;
  cmXMLWriter xout;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> __str;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  licenses;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  translations;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  userInterfaces;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> __str_6;
  cmGeneratedFileStream fout;
  undefined1 local_528 [32];
  _Rb_tree_node_base *local_508;
  size_t local_500;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_4f8;
  undefined1 local_4d8 [32];
  _Rb_tree_node_base *local_4b8;
  size_t local_4b0;
  cmXMLWriter local_4a8;
  undefined1 local_458 [40];
  _Alloc_hider local_430;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_420 [3];
  ios_base local_3e8 [264];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_2e0;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_2c8;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_2b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_298;
  undefined1 local_278 [16];
  _func_int *local_268;
  long lStack_260;
  
  if ((this->Directory)._M_string_length == 0) {
    pcVar3 = this->Installer;
    if (pcVar3 == (cmCPackIFWInstaller *)0x0) {
      pcVar5 = (this->super_cmCPackIFWCommon).Generator;
      if (pcVar5 == (cmCPackIFWGenerator *)0x0) goto LAB_0029bfb4;
      local_458._0_8_ = local_458 + 0x10;
      pcVar4 = (pcVar5->super_cmCPackGenerator).toplevel._M_dataplus._M_p;
      std::__cxx11::string::_M_construct<char*>
                ((string *)local_458,pcVar4,
                 pcVar4 + (pcVar5->super_cmCPackGenerator).toplevel._M_string_length);
      std::__cxx11::string::append((char *)local_458);
      plVar8 = (long *)std::__cxx11::string::_M_append
                                 (local_458,(ulong)(this->Name)._M_dataplus._M_p);
    }
    else {
      local_458._0_8_ = local_458 + 0x10;
      pcVar4 = (pcVar3->Directory)._M_dataplus._M_p;
      std::__cxx11::string::_M_construct<char*>
                ((string *)local_458,pcVar4,pcVar4 + (pcVar3->Directory)._M_string_length);
      std::__cxx11::string::append((char *)local_458);
      plVar8 = (long *)std::__cxx11::string::_M_append
                                 (local_458,(ulong)(this->Name)._M_dataplus._M_p);
    }
    pp_Var11 = (_func_int **)(plVar8 + 2);
    if ((_func_int **)*plVar8 == pp_Var11) {
      local_268 = *pp_Var11;
      lStack_260 = plVar8[3];
      local_278._0_8_ = &local_268;
    }
    else {
      local_268 = *pp_Var11;
      local_278._0_8_ = (_func_int **)*plVar8;
    }
    local_278._8_8_ = plVar8[1];
    *plVar8 = (long)pp_Var11;
    plVar8[1] = 0;
    *(undefined1 *)(plVar8 + 2) = 0;
    std::__cxx11::string::operator=((string *)&this->Directory,(string *)local_278);
    if ((_func_int **)local_278._0_8_ != &local_268) {
      operator_delete((void *)local_278._0_8_,(ulong)(local_268 + 1));
    }
    if ((undefined1 *)local_458._0_8_ != local_458 + 0x10) {
      operator_delete((void *)local_458._0_8_,local_458._16_8_ + 1);
    }
  }
LAB_0029bfb4:
  local_458._0_8_ = local_458 + 0x10;
  pcVar4 = (this->Directory)._M_dataplus._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)local_458,pcVar4,pcVar4 + (this->Directory)._M_string_length);
  std::__cxx11::string::append((char *)local_458);
  cmGeneratedFileStream::cmGeneratedFileStream
            ((cmGeneratedFileStream *)local_278,(char *)local_458._0_8_,false,None);
  if ((undefined1 *)local_458._0_8_ != local_458 + 0x10) {
    operator_delete((void *)local_458._0_8_,local_458._16_8_ + 1);
  }
  cmXMLWriter::cmXMLWriter(&local_4a8,(ostream *)local_278,0);
  cmXMLWriter::StartDocument(&local_4a8,"UTF-8");
  cmCPackIFWCommon::WriteGeneratedByToStrim(&this->super_cmCPackIFWCommon,&local_4a8);
  local_458._0_8_ = local_458 + 0x10;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_458,"Package","");
  cmXMLWriter::StartElement(&local_4a8,(string *)local_458);
  if ((undefined1 *)local_458._0_8_ != local_458 + 0x10) {
    operator_delete((void *)local_458._0_8_,local_458._16_8_ + 1);
  }
  p_Var9 = (this->DisplayName)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  p_Var14 = &(this->DisplayName)._M_t._M_impl.super__Rb_tree_header;
  if ((_Rb_tree_header *)p_Var9 != p_Var14) {
    do {
      local_458._0_8_ = local_458 + 0x10;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_458,"DisplayName","");
      cmXMLWriter::StartElement(&local_4a8,(string *)local_458);
      if ((undefined1 *)local_458._0_8_ != local_458 + 0x10) {
        operator_delete((void *)local_458._0_8_,local_458._16_8_ + 1);
      }
      if (p_Var9[1]._M_parent != (_Base_ptr)0x0) {
        cmXMLWriter::Attribute<std::__cxx11::string>
                  (&local_4a8,"xml:lang",
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)(p_Var9 + 1)
                  );
      }
      cmXMLWriter::Content<std::__cxx11::string>
                (&local_4a8,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)(p_Var9 + 2));
      cmXMLWriter::EndElement(&local_4a8);
      p_Var9 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var9);
    } while ((_Rb_tree_header *)p_Var9 != p_Var14);
  }
  p_Var9 = (this->Description)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  p_Var14 = &(this->Description)._M_t._M_impl.super__Rb_tree_header;
  if ((_Rb_tree_header *)p_Var9 != p_Var14) {
    do {
      local_458._0_8_ = local_458 + 0x10;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_458,"Description","");
      cmXMLWriter::StartElement(&local_4a8,(string *)local_458);
      if ((undefined1 *)local_458._0_8_ != local_458 + 0x10) {
        operator_delete((void *)local_458._0_8_,local_458._16_8_ + 1);
      }
      if (p_Var9[1]._M_parent != (_Base_ptr)0x0) {
        cmXMLWriter::Attribute<std::__cxx11::string>
                  (&local_4a8,"xml:lang",
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)(p_Var9 + 1)
                  );
      }
      cmXMLWriter::Content<std::__cxx11::string>
                (&local_4a8,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)(p_Var9 + 2));
      cmXMLWriter::EndElement(&local_4a8);
      p_Var9 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var9);
    } while ((_Rb_tree_header *)p_Var9 != p_Var14);
  }
  if ((this->UpdateText)._M_string_length != 0) {
    local_458._0_8_ = local_458 + 0x10;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_458,"UpdateText","");
    cmXMLWriter::StartElement(&local_4a8,(string *)local_458);
    cmXMLWriter::Content<std::__cxx11::string>(&local_4a8,&this->UpdateText);
    cmXMLWriter::EndElement(&local_4a8);
    if ((undefined1 *)local_458._0_8_ != local_458 + 0x10) {
      operator_delete((void *)local_458._0_8_,local_458._16_8_ + 1);
    }
  }
  local_458._0_8_ = local_458 + 0x10;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_458,"Name","");
  cmXMLWriter::StartElement(&local_4a8,(string *)local_458);
  cmXMLWriter::Content<std::__cxx11::string>(&local_4a8,&this->Name);
  cmXMLWriter::EndElement(&local_4a8);
  if ((undefined1 *)local_458._0_8_ != local_458 + 0x10) {
    operator_delete((void *)local_458._0_8_,local_458._16_8_ + 1);
  }
  local_458._0_8_ = local_458 + 0x10;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_458,"Version","");
  cmXMLWriter::StartElement(&local_4a8,(string *)local_458);
  cmXMLWriter::Content<std::__cxx11::string>(&local_4a8,&this->Version);
  cmXMLWriter::EndElement(&local_4a8);
  if ((undefined1 *)local_458._0_8_ != local_458 + 0x10) {
    operator_delete((void *)local_458._0_8_,local_458._16_8_ + 1);
  }
  if ((this->ReleaseDate)._M_string_length == 0) {
    local_458._0_8_ = local_458 + 0x10;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_458,"ReleaseDate","");
    local_528._0_8_ = local_528 + 0x10;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_528,"%Y-%m-%d","");
    cmTimestamp::CurrentTime((string *)local_4d8,(cmTimestamp *)&local_4f8,(string *)local_528,true)
    ;
    cmXMLWriter::StartElement(&local_4a8,(string *)local_458);
    cmXMLWriter::Content<std::__cxx11::string>
              (&local_4a8,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_4d8);
    cmXMLWriter::EndElement(&local_4a8);
    if ((undefined1 *)local_4d8._0_8_ != local_4d8 + 0x10) {
      operator_delete((void *)local_4d8._0_8_,local_4d8._16_8_ + 1);
    }
    if ((undefined1 *)local_528._0_8_ != local_528 + 0x10) {
      operator_delete((void *)local_528._0_8_,local_528._16_8_ + 1);
    }
  }
  else {
    local_458._0_8_ = local_458 + 0x10;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_458,"ReleaseDate","");
    cmXMLWriter::StartElement(&local_4a8,(string *)local_458);
    cmXMLWriter::Content<std::__cxx11::string>(&local_4a8,&this->ReleaseDate);
    cmXMLWriter::EndElement(&local_4a8);
  }
  if ((undefined1 *)local_458._0_8_ != local_458 + 0x10) {
    operator_delete((void *)local_458._0_8_,local_458._16_8_ + 1);
  }
  if ((this->Script)._M_string_length != 0) {
    cmsys::SystemTools::GetFilenameName((string *)local_458,&this->Script);
    pcVar1 = local_528 + 0x10;
    pcVar4 = (this->Directory)._M_dataplus._M_p;
    local_528._0_8_ = pcVar1;
    std::__cxx11::string::_M_construct<char*>
              ((string *)local_528,pcVar4,pcVar4 + (this->Directory)._M_string_length);
    std::__cxx11::string::append(local_528);
    plVar8 = (long *)std::__cxx11::string::_M_append(local_528,local_458._0_8_);
    psVar12 = (size_type *)(plVar8 + 2);
    if ((size_type *)*plVar8 == psVar12) {
      local_4d8._16_8_ = *psVar12;
      local_4d8._24_8_ = plVar8[3];
      local_4d8._0_8_ = local_4d8 + 0x10;
    }
    else {
      local_4d8._16_8_ = *psVar12;
      local_4d8._0_8_ = (size_type *)*plVar8;
    }
    local_4d8._8_8_ = plVar8[1];
    *plVar8 = (long)psVar12;
    plVar8[1] = 0;
    *(undefined1 *)(plVar8 + 2) = 0;
    if ((char *)local_528._0_8_ != pcVar1) {
      operator_delete((void *)local_528._0_8_,local_528._16_8_ + 1);
    }
    cmsys::SystemTools::CopyFileIfDifferent(&this->Script,(string *)local_4d8);
    local_528._0_8_ = pcVar1;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_528,"Script","");
    cmXMLWriter::StartElement(&local_4a8,(string *)local_528);
    cmXMLWriter::Content<std::__cxx11::string>
              (&local_4a8,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_458);
    cmXMLWriter::EndElement(&local_4a8);
    if ((char *)local_528._0_8_ != pcVar1) {
      operator_delete((void *)local_528._0_8_,local_528._16_8_ + 1);
    }
    if ((undefined1 *)local_4d8._0_8_ != local_4d8 + 0x10) {
      operator_delete((void *)local_4d8._0_8_,local_4d8._16_8_ + 1);
    }
    if ((undefined1 *)local_458._0_8_ != local_458 + 0x10) {
      operator_delete((void *)local_458._0_8_,local_458._16_8_ + 1);
    }
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(&local_2b0,&this->UserInterfaces);
  if (local_2b0.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish !=
      local_2b0.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start) {
    lVar13 = 0;
    uVar15 = 0;
    do {
      cmsys::SystemTools::GetFilenameName
                ((string *)local_458,
                 (string *)
                 ((long)&((local_2b0.
                           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_start)->_M_dataplus)._M_p + lVar13));
      pcVar4 = (this->Directory)._M_dataplus._M_p;
      local_528._0_8_ = local_528 + 0x10;
      std::__cxx11::string::_M_construct<char*>
                ((string *)local_528,pcVar4,pcVar4 + (this->Directory)._M_string_length);
      std::__cxx11::string::append((char *)local_528);
      plVar8 = (long *)std::__cxx11::string::_M_append((char *)local_528,local_458._0_8_);
      psVar12 = (size_type *)(plVar8 + 2);
      if ((size_type *)*plVar8 == psVar12) {
        local_4d8._16_8_ = *psVar12;
        local_4d8._24_8_ = plVar8[3];
        local_4d8._0_8_ = local_4d8 + 0x10;
      }
      else {
        local_4d8._16_8_ = *psVar12;
        local_4d8._0_8_ = (size_type *)*plVar8;
      }
      local_4d8._8_8_ = plVar8[1];
      *plVar8 = (long)psVar12;
      plVar8[1] = 0;
      *(undefined1 *)(plVar8 + 2) = 0;
      if ((undefined1 *)local_528._0_8_ != local_528 + 0x10) {
        operator_delete((void *)local_528._0_8_,local_528._16_8_ + 1);
      }
      cmsys::SystemTools::CopyFileIfDifferent
                ((string *)
                 ((long)&((local_2b0.
                           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_start)->_M_dataplus)._M_p + lVar13),
                 (string *)local_4d8);
      std::__cxx11::string::_M_assign
                ((string *)
                 ((long)&((local_2b0.
                           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_start)->_M_dataplus)._M_p + lVar13));
      if ((undefined1 *)local_4d8._0_8_ != local_4d8 + 0x10) {
        operator_delete((void *)local_4d8._0_8_,local_4d8._16_8_ + 1);
      }
      if ((undefined1 *)local_458._0_8_ != local_458 + 0x10) {
        operator_delete((void *)local_458._0_8_,local_458._16_8_ + 1);
      }
      uVar15 = uVar15 + 1;
      lVar13 = lVar13 + 0x20;
    } while (uVar15 < (ulong)((long)local_2b0.
                                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                    ._M_impl.super__Vector_impl_data._M_finish -
                              (long)local_2b0.
                                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                    ._M_impl.super__Vector_impl_data._M_start >> 5));
    if (local_2b0.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start !=
        local_2b0.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish) {
      local_458._0_8_ = local_458 + 0x10;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_458,"UserInterfaces","");
      cmXMLWriter::StartElement(&local_4a8,(string *)local_458);
      if ((undefined1 *)local_458._0_8_ != local_458 + 0x10) {
        operator_delete((void *)local_458._0_8_,local_458._16_8_ + 1);
      }
      if (local_2b0.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_finish !=
          local_2b0.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_start) {
        lVar13 = 0;
        uVar15 = 0;
        do {
          local_458._0_8_ = local_458 + 0x10;
          std::__cxx11::string::_M_construct<char_const*>((string *)local_458,"UserInterface","");
          pbVar7 = local_2b0.
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start;
          cmXMLWriter::StartElement(&local_4a8,(string *)local_458);
          cmXMLWriter::Content<std::__cxx11::string>
                    (&local_4a8,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     ((long)&(pbVar7->_M_dataplus)._M_p + lVar13));
          cmXMLWriter::EndElement(&local_4a8);
          if ((undefined1 *)local_458._0_8_ != local_458 + 0x10) {
            operator_delete((void *)local_458._0_8_,local_458._16_8_ + 1);
          }
          uVar15 = uVar15 + 1;
          lVar13 = lVar13 + 0x20;
        } while (uVar15 < (ulong)((long)local_2b0.
                                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                        ._M_impl.super__Vector_impl_data._M_finish -
                                  (long)local_2b0.
                                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                        ._M_impl.super__Vector_impl_data._M_start >> 5));
      }
      cmXMLWriter::EndElement(&local_4a8);
    }
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(&local_2c8,&this->Translations);
  if (local_2c8.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish !=
      local_2c8.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start) {
    lVar13 = 0;
    uVar15 = 0;
    do {
      cmsys::SystemTools::GetFilenameName
                ((string *)local_458,
                 (string *)
                 ((long)&((local_2c8.
                           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_start)->_M_dataplus)._M_p + lVar13));
      pcVar4 = (this->Directory)._M_dataplus._M_p;
      local_528._0_8_ = local_528 + 0x10;
      std::__cxx11::string::_M_construct<char*>
                ((string *)local_528,pcVar4,pcVar4 + (this->Directory)._M_string_length);
      std::__cxx11::string::append((char *)local_528);
      plVar8 = (long *)std::__cxx11::string::_M_append((char *)local_528,local_458._0_8_);
      psVar12 = (size_type *)(plVar8 + 2);
      if ((size_type *)*plVar8 == psVar12) {
        local_4d8._16_8_ = *psVar12;
        local_4d8._24_8_ = plVar8[3];
        local_4d8._0_8_ = local_4d8 + 0x10;
      }
      else {
        local_4d8._16_8_ = *psVar12;
        local_4d8._0_8_ = (size_type *)*plVar8;
      }
      local_4d8._8_8_ = plVar8[1];
      *plVar8 = (long)psVar12;
      plVar8[1] = 0;
      *(undefined1 *)(plVar8 + 2) = 0;
      if ((undefined1 *)local_528._0_8_ != local_528 + 0x10) {
        operator_delete((void *)local_528._0_8_,local_528._16_8_ + 1);
      }
      cmsys::SystemTools::CopyFileIfDifferent
                ((string *)
                 ((long)&((local_2c8.
                           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_start)->_M_dataplus)._M_p + lVar13),
                 (string *)local_4d8);
      std::__cxx11::string::_M_assign
                ((string *)
                 ((long)&((local_2c8.
                           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_start)->_M_dataplus)._M_p + lVar13));
      if ((undefined1 *)local_4d8._0_8_ != local_4d8 + 0x10) {
        operator_delete((void *)local_4d8._0_8_,local_4d8._16_8_ + 1);
      }
      if ((undefined1 *)local_458._0_8_ != local_458 + 0x10) {
        operator_delete((void *)local_458._0_8_,local_458._16_8_ + 1);
      }
      uVar15 = uVar15 + 1;
      lVar13 = lVar13 + 0x20;
    } while (uVar15 < (ulong)((long)local_2c8.
                                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                    ._M_impl.super__Vector_impl_data._M_finish -
                              (long)local_2c8.
                                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                    ._M_impl.super__Vector_impl_data._M_start >> 5));
    if (local_2c8.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start !=
        local_2c8.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish) {
      local_458._0_8_ = local_458 + 0x10;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_458,"Translations","");
      cmXMLWriter::StartElement(&local_4a8,(string *)local_458);
      if ((undefined1 *)local_458._0_8_ != local_458 + 0x10) {
        operator_delete((void *)local_458._0_8_,local_458._16_8_ + 1);
      }
      if (local_2c8.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_finish !=
          local_2c8.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_start) {
        lVar13 = 0;
        uVar15 = 0;
        do {
          local_458._0_8_ = local_458 + 0x10;
          std::__cxx11::string::_M_construct<char_const*>((string *)local_458,"Translation","");
          pbVar7 = local_2c8.
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start;
          cmXMLWriter::StartElement(&local_4a8,(string *)local_458);
          cmXMLWriter::Content<std::__cxx11::string>
                    (&local_4a8,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     ((long)&(pbVar7->_M_dataplus)._M_p + lVar13));
          cmXMLWriter::EndElement(&local_4a8);
          if ((undefined1 *)local_458._0_8_ != local_458 + 0x10) {
            operator_delete((void *)local_458._0_8_,local_458._16_8_ + 1);
          }
          uVar15 = uVar15 + 1;
          lVar13 = lVar13 + 0x20;
        } while (uVar15 < (ulong)((long)local_2c8.
                                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                        ._M_impl.super__Vector_impl_data._M_finish -
                                  (long)local_2c8.
                                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                        ._M_impl.super__Vector_impl_data._M_start >> 5));
      }
      cmXMLWriter::EndElement(&local_4a8);
    }
  }
  local_4d8._24_8_ = local_4d8 + 8;
  local_4d8._8_8_ = local_4d8._8_8_ & 0xffffffff00000000;
  local_4d8._16_8_ = 0;
  local_4b0 = 0;
  p_Var9 = (this->AlienDependencies)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  p_Var14 = &(this->AlienDependencies)._M_t._M_impl.super__Rb_tree_header;
  local_4b8 = (_Rb_tree_node_base *)local_4d8._24_8_;
  if ((_Rb_tree_header *)p_Var9 != p_Var14) {
    do {
      std::
      _Rb_tree<cmCPackIFWPackage::DependenceStruct,cmCPackIFWPackage::DependenceStruct,std::_Identity<cmCPackIFWPackage::DependenceStruct>,std::less<cmCPackIFWPackage::DependenceStruct>,std::allocator<cmCPackIFWPackage::DependenceStruct>>
      ::_M_insert_unique<cmCPackIFWPackage::DependenceStruct_const&>
                ((_Rb_tree<cmCPackIFWPackage::DependenceStruct,cmCPackIFWPackage::DependenceStruct,std::_Identity<cmCPackIFWPackage::DependenceStruct>,std::less<cmCPackIFWPackage::DependenceStruct>,std::allocator<cmCPackIFWPackage::DependenceStruct>>
                  *)local_4d8,*(DependenceStruct **)(p_Var9 + 1));
      p_Var9 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var9);
    } while ((_Rb_tree_header *)p_Var9 != p_Var14);
  }
  p_Var9 = (this->Dependencies)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  p_Var14 = &(this->Dependencies)._M_t._M_impl.super__Rb_tree_header;
  if ((_Rb_tree_header *)p_Var9 != p_Var14) {
    do {
      DependenceStruct::DependenceStruct
                ((DependenceStruct *)local_458,(string *)(*(long *)(p_Var9 + 1) + 0xa8));
      std::
      _Rb_tree<cmCPackIFWPackage::DependenceStruct,_cmCPackIFWPackage::DependenceStruct,_std::_Identity<cmCPackIFWPackage::DependenceStruct>,_std::less<cmCPackIFWPackage::DependenceStruct>,_std::allocator<cmCPackIFWPackage::DependenceStruct>_>
      ::_M_insert_unique<cmCPackIFWPackage::DependenceStruct>
                ((_Rb_tree<cmCPackIFWPackage::DependenceStruct,_cmCPackIFWPackage::DependenceStruct,_std::_Identity<cmCPackIFWPackage::DependenceStruct>,_std::less<cmCPackIFWPackage::DependenceStruct>,_std::allocator<cmCPackIFWPackage::DependenceStruct>_>
                  *)local_4d8,(DependenceStruct *)local_458);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_430._M_p != local_420) {
        operator_delete(local_430._M_p,local_420[0]._M_allocated_capacity + 1);
      }
      if ((undefined1 *)local_458._0_8_ != local_458 + 0x10) {
        operator_delete((void *)local_458._0_8_,local_458._16_8_ + 1);
      }
      p_Var9 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var9);
    } while ((_Rb_tree_header *)p_Var9 != p_Var14);
  }
  if (local_4b0 != 0) {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_458);
    uVar6 = local_4d8._24_8_;
    DependenceStruct::NameWithCompare_abi_cxx11_
              ((string *)local_528,(DependenceStruct *)(local_4d8._24_8_ + 0x20));
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_458,(char *)local_528._0_8_,
               CONCAT44(local_528._12_4_,local_528._8_4_));
    pcVar1 = local_528 + 0x10;
    if ((char *)local_528._0_8_ != pcVar1) {
      operator_delete((void *)local_528._0_8_,local_528._16_8_ + 1);
    }
    p_Var9 = (_Rb_tree_node_base *)std::_Rb_tree_increment((_Rb_tree_node_base *)uVar6);
    if (p_Var9 != (_Rb_tree_node_base *)(local_4d8 + 8)) {
      do {
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_458,",",1);
        DependenceStruct::NameWithCompare_abi_cxx11_
                  ((string *)local_528,(DependenceStruct *)(p_Var9 + 1));
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_458,(char *)local_528._0_8_,
                   CONCAT44(local_528._12_4_,local_528._8_4_));
        if ((char *)local_528._0_8_ != pcVar1) {
          operator_delete((void *)local_528._0_8_,local_528._16_8_ + 1);
        }
        p_Var9 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var9);
      } while (p_Var9 != (_Rb_tree_node_base *)(local_4d8 + 8));
    }
    local_528._0_8_ = pcVar1;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_528,"Dependencies","");
    std::__cxx11::stringbuf::str();
    cmXMLWriter::StartElement(&local_4a8,(string *)local_528);
    cmXMLWriter::Content<std::__cxx11::string>(&local_4a8,&local_4f8);
    cmXMLWriter::EndElement(&local_4a8);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_4f8._M_dataplus._M_p != &local_4f8.field_2) {
      operator_delete(local_4f8._M_dataplus._M_p,local_4f8.field_2._M_allocated_capacity + 1);
    }
    if ((char *)local_528._0_8_ != pcVar1) {
      operator_delete((void *)local_528._0_8_,local_528._16_8_ + 1);
    }
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_458);
    std::ios_base::~ios_base(local_3e8);
  }
  p_Var9 = (_Rb_tree_node_base *)(local_528 + 8);
  local_528._8_4_ = _S_red;
  local_528._16_8_ = 0;
  local_500 = 0;
  p_Var10 = (this->AlienAutoDependOn)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  p_Var14 = &(this->AlienAutoDependOn)._M_t._M_impl.super__Rb_tree_header;
  local_528._24_8_ = p_Var9;
  local_508 = p_Var9;
  if ((_Rb_tree_header *)p_Var10 != p_Var14) {
    do {
      std::
      _Rb_tree<cmCPackIFWPackage::DependenceStruct,cmCPackIFWPackage::DependenceStruct,std::_Identity<cmCPackIFWPackage::DependenceStruct>,std::less<cmCPackIFWPackage::DependenceStruct>,std::allocator<cmCPackIFWPackage::DependenceStruct>>
      ::_M_insert_unique<cmCPackIFWPackage::DependenceStruct_const&>
                ((_Rb_tree<cmCPackIFWPackage::DependenceStruct,cmCPackIFWPackage::DependenceStruct,std::_Identity<cmCPackIFWPackage::DependenceStruct>,std::less<cmCPackIFWPackage::DependenceStruct>,std::allocator<cmCPackIFWPackage::DependenceStruct>>
                  *)local_528,*(DependenceStruct **)(p_Var10 + 1));
      p_Var10 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var10);
    } while ((_Rb_tree_header *)p_Var10 != p_Var14);
    if (local_500 != 0) {
      std::__cxx11::ostringstream::ostringstream((ostringstream *)local_458);
      uVar6 = local_528._24_8_;
      DependenceStruct::NameWithCompare_abi_cxx11_
                (&local_4f8,(DependenceStruct *)(local_528._24_8_ + 0x20));
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_458,local_4f8._M_dataplus._M_p,local_4f8._M_string_length);
      paVar2 = &local_4f8.field_2;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_4f8._M_dataplus._M_p != paVar2) {
        operator_delete(local_4f8._M_dataplus._M_p,local_4f8.field_2._M_allocated_capacity + 1);
      }
      p_Var10 = (_Rb_tree_node_base *)std::_Rb_tree_increment((_Rb_tree_node_base *)uVar6);
      if (p_Var10 != p_Var9) {
        do {
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_458,",",1);
          DependenceStruct::NameWithCompare_abi_cxx11_(&local_4f8,(DependenceStruct *)(p_Var10 + 1))
          ;
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)local_458,local_4f8._M_dataplus._M_p,local_4f8._M_string_length);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_4f8._M_dataplus._M_p != paVar2) {
            operator_delete(local_4f8._M_dataplus._M_p,local_4f8.field_2._M_allocated_capacity + 1);
          }
          p_Var10 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var10);
        } while (p_Var10 != p_Var9);
      }
      local_4f8._M_dataplus._M_p = (pointer)paVar2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_4f8,"AutoDependOn","");
      std::__cxx11::stringbuf::str();
      cmXMLWriter::StartElement(&local_4a8,&local_4f8);
      cmXMLWriter::Content<std::__cxx11::string>(&local_4a8,&local_298);
      cmXMLWriter::EndElement(&local_4a8);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_298._M_dataplus._M_p != &local_298.field_2) {
        operator_delete(local_298._M_dataplus._M_p,local_298.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_4f8._M_dataplus._M_p != paVar2) {
        operator_delete(local_4f8._M_dataplus._M_p,local_4f8.field_2._M_allocated_capacity + 1);
      }
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_458);
      std::ios_base::~ios_base(local_3e8);
    }
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(&local_2e0,&this->Licenses);
  if (0x20 < (ulong)((long)local_2e0.
                           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_finish -
                    (long)local_2e0.
                          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_start)) {
    uVar15 = 1;
    lVar13 = 0x20;
    do {
      cmsys::SystemTools::GetFilenameName
                ((string *)local_458,
                 (string *)
                 ((long)&((local_2e0.
                           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_start)->_M_dataplus)._M_p + lVar13));
      pcVar4 = (this->Directory)._M_dataplus._M_p;
      local_298._M_dataplus._M_p = (pointer)&local_298.field_2;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_298,pcVar4,pcVar4 + (this->Directory)._M_string_length);
      std::__cxx11::string::append((char *)&local_298);
      plVar8 = (long *)std::__cxx11::string::_M_append((char *)&local_298,local_458._0_8_);
      psVar12 = (size_type *)(plVar8 + 2);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*plVar8 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)psVar12) {
        local_4f8.field_2._M_allocated_capacity = *psVar12;
        local_4f8.field_2._8_8_ = plVar8[3];
        local_4f8._M_dataplus._M_p = (pointer)&local_4f8.field_2;
      }
      else {
        local_4f8.field_2._M_allocated_capacity = *psVar12;
        local_4f8._M_dataplus._M_p = (pointer)*plVar8;
      }
      local_4f8._M_string_length = plVar8[1];
      *plVar8 = (long)psVar12;
      plVar8[1] = 0;
      *(undefined1 *)(plVar8 + 2) = 0;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_298._M_dataplus._M_p != &local_298.field_2) {
        operator_delete(local_298._M_dataplus._M_p,local_298.field_2._M_allocated_capacity + 1);
      }
      cmsys::SystemTools::CopyFileIfDifferent
                ((string *)
                 ((long)&((local_2e0.
                           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_start)->_M_dataplus)._M_p + lVar13),
                 &local_4f8);
      std::__cxx11::string::_M_assign
                ((string *)
                 ((long)&((local_2e0.
                           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_start)->_M_dataplus)._M_p + lVar13));
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_4f8._M_dataplus._M_p != &local_4f8.field_2) {
        operator_delete(local_4f8._M_dataplus._M_p,local_4f8.field_2._M_allocated_capacity + 1);
      }
      if ((undefined1 *)local_458._0_8_ != local_458 + 0x10) {
        operator_delete((void *)local_458._0_8_,local_458._16_8_ + 1);
      }
      uVar15 = uVar15 + 2;
      lVar13 = lVar13 + 0x40;
    } while (uVar15 < (ulong)((long)local_2e0.
                                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                    ._M_impl.super__Vector_impl_data._M_finish -
                              (long)local_2e0.
                                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                    ._M_impl.super__Vector_impl_data._M_start >> 5));
  }
  if (local_2e0.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start !=
      local_2e0.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    local_458._0_8_ = local_458 + 0x10;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_458,"Licenses","");
    cmXMLWriter::StartElement(&local_4a8,(string *)local_458);
    if ((undefined1 *)local_458._0_8_ != local_458 + 0x10) {
      operator_delete((void *)local_458._0_8_,local_458._16_8_ + 1);
    }
    if (local_2e0.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish !=
        local_2e0.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start) {
      lVar13 = 0x20;
      uVar15 = 0;
      do {
        local_458._0_8_ = local_458 + 0x10;
        std::__cxx11::string::_M_construct<char_const*>((string *)local_458,"License","");
        cmXMLWriter::StartElement(&local_4a8,(string *)local_458);
        if ((undefined1 *)local_458._0_8_ != local_458 + 0x10) {
          operator_delete((void *)local_458._0_8_,local_458._16_8_ + 1);
        }
        cmXMLWriter::Attribute<std::__cxx11::string>
                  (&local_4a8,"name",
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   ((long)&local_2e0.
                           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_start[-1]._M_dataplus._M_p + lVar13))
        ;
        cmXMLWriter::Attribute<std::__cxx11::string>
                  (&local_4a8,"file",
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   ((long)&((local_2e0.
                             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             ._M_impl.super__Vector_impl_data._M_start)->_M_dataplus)._M_p + lVar13)
                  );
        cmXMLWriter::EndElement(&local_4a8);
        uVar15 = uVar15 + 2;
        lVar13 = lVar13 + 0x40;
      } while (uVar15 < (ulong)((long)local_2e0.
                                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                      ._M_impl.super__Vector_impl_data._M_finish -
                                (long)local_2e0.
                                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                      ._M_impl.super__Vector_impl_data._M_start >> 5));
    }
    cmXMLWriter::EndElement(&local_4a8);
  }
  if ((this->ForcedInstallation)._M_string_length != 0) {
    local_458._0_8_ = local_458 + 0x10;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_458,"ForcedInstallation","");
    cmXMLWriter::StartElement(&local_4a8,(string *)local_458);
    cmXMLWriter::Content<std::__cxx11::string>(&local_4a8,&this->ForcedInstallation);
    cmXMLWriter::EndElement(&local_4a8);
    if ((undefined1 *)local_458._0_8_ != local_458 + 0x10) {
      operator_delete((void *)local_458._0_8_,local_458._16_8_ + 1);
    }
  }
  if ((this->RequiresAdminRights)._M_string_length != 0) {
    local_458._0_8_ = local_458 + 0x10;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_458,"RequiresAdminRights","");
    cmXMLWriter::StartElement(&local_4a8,(string *)local_458);
    cmXMLWriter::Content<std::__cxx11::string>(&local_4a8,&this->RequiresAdminRights);
    cmXMLWriter::EndElement(&local_4a8);
    if ((undefined1 *)local_458._0_8_ != local_458 + 0x10) {
      operator_delete((void *)local_458._0_8_,local_458._16_8_ + 1);
    }
  }
  if ((this->Virtual)._M_string_length == 0) {
    if ((this->Default)._M_string_length == 0) goto LAB_0029d5ed;
    local_458._0_8_ = local_458 + 0x10;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_458,"Default","");
    cmXMLWriter::StartElement(&local_4a8,(string *)local_458);
    cmXMLWriter::Content<std::__cxx11::string>(&local_4a8,&this->Default);
    cmXMLWriter::EndElement(&local_4a8);
  }
  else {
    local_458._0_8_ = local_458 + 0x10;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_458,"Virtual","");
    cmXMLWriter::StartElement(&local_4a8,(string *)local_458);
    cmXMLWriter::Content<std::__cxx11::string>(&local_4a8,&this->Virtual);
    cmXMLWriter::EndElement(&local_4a8);
  }
  if ((undefined1 *)local_458._0_8_ != local_458 + 0x10) {
    operator_delete((void *)local_458._0_8_,local_458._16_8_ + 1);
  }
LAB_0029d5ed:
  if ((this->Essential)._M_string_length != 0) {
    local_458._0_8_ = local_458 + 0x10;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_458,"Essential","");
    cmXMLWriter::StartElement(&local_4a8,(string *)local_458);
    cmXMLWriter::Content<std::__cxx11::string>(&local_4a8,&this->Essential);
    cmXMLWriter::EndElement(&local_4a8);
    if ((undefined1 *)local_458._0_8_ != local_458 + 0x10) {
      operator_delete((void *)local_458._0_8_,local_458._16_8_ + 1);
    }
  }
  if ((this->SortingPriority)._M_string_length != 0) {
    local_458._0_8_ = local_458 + 0x10;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_458,"SortingPriority","");
    cmXMLWriter::StartElement(&local_4a8,(string *)local_458);
    cmXMLWriter::Content<std::__cxx11::string>(&local_4a8,&this->SortingPriority);
    cmXMLWriter::EndElement(&local_4a8);
    if ((undefined1 *)local_458._0_8_ != local_458 + 0x10) {
      operator_delete((void *)local_458._0_8_,local_458._16_8_ + 1);
    }
  }
  cmXMLWriter::EndElement(&local_4a8);
  cmXMLWriter::EndDocument(&local_4a8);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_2e0);
  std::
  _Rb_tree<cmCPackIFWPackage::DependenceStruct,_cmCPackIFWPackage::DependenceStruct,_std::_Identity<cmCPackIFWPackage::DependenceStruct>,_std::less<cmCPackIFWPackage::DependenceStruct>,_std::allocator<cmCPackIFWPackage::DependenceStruct>_>
  ::~_Rb_tree((_Rb_tree<cmCPackIFWPackage::DependenceStruct,_cmCPackIFWPackage::DependenceStruct,_std::_Identity<cmCPackIFWPackage::DependenceStruct>,_std::less<cmCPackIFWPackage::DependenceStruct>,_std::allocator<cmCPackIFWPackage::DependenceStruct>_>
               *)local_528);
  std::
  _Rb_tree<cmCPackIFWPackage::DependenceStruct,_cmCPackIFWPackage::DependenceStruct,_std::_Identity<cmCPackIFWPackage::DependenceStruct>,_std::less<cmCPackIFWPackage::DependenceStruct>,_std::allocator<cmCPackIFWPackage::DependenceStruct>_>
  ::~_Rb_tree((_Rb_tree<cmCPackIFWPackage::DependenceStruct,_cmCPackIFWPackage::DependenceStruct,_std::_Identity<cmCPackIFWPackage::DependenceStruct>,_std::less<cmCPackIFWPackage::DependenceStruct>,_std::allocator<cmCPackIFWPackage::DependenceStruct>_>
               *)local_4d8);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_2c8);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_2b0);
  cmXMLWriter::~cmXMLWriter(&local_4a8);
  cmGeneratedFileStream::~cmGeneratedFileStream((cmGeneratedFileStream *)local_278);
  return;
}

Assistant:

void cmCPackIFWPackage::GeneratePackageFile()
{
  // Lazy directory initialization
  if (this->Directory.empty()) {
    if (this->Installer) {
      this->Directory = this->Installer->Directory + "/packages/" + this->Name;
    } else if (this->Generator) {
      this->Directory = this->Generator->toplevel + "/packages/" + this->Name;
    }
  }

  // Output stream
  cmGeneratedFileStream fout((this->Directory + "/meta/package.xml").data());
  cmXMLWriter xout(fout);

  xout.StartDocument();

  WriteGeneratedByToStrim(xout);

  xout.StartElement("Package");

  // DisplayName (with translations)
  for (std::map<std::string, std::string>::iterator it =
         this->DisplayName.begin();
       it != this->DisplayName.end(); ++it) {
    xout.StartElement("DisplayName");
    if (!it->first.empty()) {
      xout.Attribute("xml:lang", it->first);
    }
    xout.Content(it->second);
    xout.EndElement();
  }

  // Description (with translations)
  for (std::map<std::string, std::string>::iterator it =
         this->Description.begin();
       it != this->Description.end(); ++it) {
    xout.StartElement("Description");
    if (!it->first.empty()) {
      xout.Attribute("xml:lang", it->first);
    }
    xout.Content(it->second);
    xout.EndElement();
  }

  // Update text
  if (!this->UpdateText.empty()) {
    xout.Element("UpdateText", this->UpdateText);
  }

  xout.Element("Name", this->Name);
  xout.Element("Version", this->Version);

  if (!this->ReleaseDate.empty()) {
    xout.Element("ReleaseDate", this->ReleaseDate);
  } else {
    xout.Element("ReleaseDate", cmTimestamp().CurrentTime("%Y-%m-%d", true));
  }

  // Script (copy to meta dir)
  if (!this->Script.empty()) {
    std::string name = cmSystemTools::GetFilenameName(this->Script);
    std::string path = this->Directory + "/meta/" + name;
    cmsys::SystemTools::CopyFileIfDifferent(this->Script, path);
    xout.Element("Script", name);
  }

  // User Interfaces (copy to meta dir)
  std::vector<std::string> userInterfaces = UserInterfaces;
  for (size_t i = 0; i < userInterfaces.size(); i++) {
    std::string name = cmSystemTools::GetFilenameName(userInterfaces[i]);
    std::string path = this->Directory + "/meta/" + name;
    cmsys::SystemTools::CopyFileIfDifferent(userInterfaces[i], path);
    userInterfaces[i] = name;
  }
  if (!userInterfaces.empty()) {
    xout.StartElement("UserInterfaces");
    for (size_t i = 0; i < userInterfaces.size(); i++) {
      xout.Element("UserInterface", userInterfaces[i]);
    }
    xout.EndElement();
  }

  // Translations (copy to meta dir)
  std::vector<std::string> translations = Translations;
  for (size_t i = 0; i < translations.size(); i++) {
    std::string name = cmSystemTools::GetFilenameName(translations[i]);
    std::string path = this->Directory + "/meta/" + name;
    cmsys::SystemTools::CopyFileIfDifferent(translations[i], path);
    translations[i] = name;
  }
  if (!translations.empty()) {
    xout.StartElement("Translations");
    for (size_t i = 0; i < translations.size(); i++) {
      xout.Element("Translation", translations[i]);
    }
    xout.EndElement();
  }

  // Dependencies
  std::set<DependenceStruct> compDepSet;
  for (std::set<DependenceStruct*>::iterator ait =
         this->AlienDependencies.begin();
       ait != this->AlienDependencies.end(); ++ait) {
    compDepSet.insert(*(*ait));
  }
  for (std::set<cmCPackIFWPackage*>::iterator it = this->Dependencies.begin();
       it != this->Dependencies.end(); ++it) {
    compDepSet.insert(DependenceStruct((*it)->Name));
  }
  // Write dependencies
  if (!compDepSet.empty()) {
    std::ostringstream dependencies;
    std::set<DependenceStruct>::iterator it = compDepSet.begin();
    dependencies << it->NameWithCompare();
    ++it;
    while (it != compDepSet.end()) {
      dependencies << "," << it->NameWithCompare();
      ++it;
    }
    xout.Element("Dependencies", dependencies.str());
  }

  // Automatic dependency on
  std::set<DependenceStruct> compAutoDepSet;
  for (std::set<DependenceStruct*>::iterator ait =
         this->AlienAutoDependOn.begin();
       ait != this->AlienAutoDependOn.end(); ++ait) {
    compAutoDepSet.insert(*(*ait));
  }
  // Write automatic dependency on
  if (!compAutoDepSet.empty()) {
    std::ostringstream dependencies;
    std::set<DependenceStruct>::iterator it = compAutoDepSet.begin();
    dependencies << it->NameWithCompare();
    ++it;
    while (it != compAutoDepSet.end()) {
      dependencies << "," << it->NameWithCompare();
      ++it;
    }
    xout.Element("AutoDependOn", dependencies.str());
  }

  // Licenses (copy to meta dir)
  std::vector<std::string> licenses = this->Licenses;
  for (size_t i = 1; i < licenses.size(); i += 2) {
    std::string name = cmSystemTools::GetFilenameName(licenses[i]);
    std::string path = this->Directory + "/meta/" + name;
    cmsys::SystemTools::CopyFileIfDifferent(licenses[i], path);
    licenses[i] = name;
  }
  if (!licenses.empty()) {
    xout.StartElement("Licenses");
    for (size_t i = 0; i < licenses.size(); i += 2) {
      xout.StartElement("License");
      xout.Attribute("name", licenses[i]);
      xout.Attribute("file", licenses[i + 1]);
      xout.EndElement();
    }
    xout.EndElement();
  }

  if (!this->ForcedInstallation.empty()) {
    xout.Element("ForcedInstallation", this->ForcedInstallation);
  }

  if (!this->RequiresAdminRights.empty()) {
    xout.Element("RequiresAdminRights", this->RequiresAdminRights);
  }

  if (!this->Virtual.empty()) {
    xout.Element("Virtual", this->Virtual);
  } else if (!this->Default.empty()) {
    xout.Element("Default", this->Default);
  }

  // Essential
  if (!this->Essential.empty()) {
    xout.Element("Essential", this->Essential);
  }

  // Priority
  if (!this->SortingPriority.empty()) {
    xout.Element("SortingPriority", this->SortingPriority);
  }

  xout.EndElement();
  xout.EndDocument();
}